

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# character.cpp
# Opt level: O2

short __thiscall Character::SpellLevel(Character *this,short spell)

{
  _List_node_base *p_Var1;
  undefined2 in_register_00000032;
  
  p_Var1 = (_List_node_base *)&this->spells;
  do {
    p_Var1 = (((_List_base<Character_Spell,_std::allocator<Character_Spell>_> *)&p_Var1->_M_next)->
             _M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var1 == (_List_node_base *)&this->spells) {
      return 0;
    }
  } while ((int)*(short *)&p_Var1[1]._M_next != CONCAT22(in_register_00000032,spell));
  return (short)(byte)*(undefined1 *)((long)&p_Var1[1]._M_next + 2);
}

Assistant:

short Character::SpellLevel(short spell)
{
	auto it = std::find_if(UTIL_RANGE(this->spells), [&](Character_Spell cs)
												 { return cs.id == spell; });

	if (it != this->spells.end())
		return it->level;
	else
		return 0;
}